

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O2

libcaption_stauts_t caption_frame_decode_text(caption_frame_t *frame,uint16_t cc_data)

{
  int iVar1;
  char char2 [5];
  char char1 [5];
  int chan;
  
  iVar1 = eia608_to_utf8(cc_data,&chan,char1,char2);
  if ((cc_data & 0x7660) == 0x1220) {
    caption_frame_backspace(frame);
  }
  if (iVar1 != 0) {
    eia608_write_char(frame,char1);
    if (iVar1 != 1) {
      eia608_write_char(frame,char2);
    }
  }
  return LIBCAPTION_OK;
}

Assistant:

libcaption_stauts_t caption_frame_decode_text(caption_frame_t* frame, uint16_t cc_data)
{
    int chan;
    char char1[5], char2[5];
    size_t chars = eia608_to_utf8(cc_data, &chan, &char1[0], &char2[0]);

    if (eia608_is_westeu(cc_data)) {
        // Extended charcters replace the previous charcter for back compatibility
        caption_frame_backspace(frame);
    }

    if (0 < chars) {
        eia608_write_char(frame, char1);
    }

    if (1 < chars) {
        eia608_write_char(frame, char2);
    }

    return LIBCAPTION_OK;
}